

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect-selection.cpp
# Opt level: O3

void __thiscall pal::RectHandle::setPosition(RectHandle *this,double p)

{
  Orientation OVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double _t1;
  
  _t1 = this->m_max_pos;
  if (p <= this->m_max_pos) {
    _t1 = p;
  }
  if (_t1 <= this->m_min_pos) {
    _t1 = this->m_min_pos;
  }
  OVar1 = this->m_orientation;
  dVar6 = _t1;
  dVar4 = (double)QGraphicsItem::pos();
  if (OVar1 != Horizontal) {
    dVar6 = dVar4;
  }
  dVar5 = _t1 - dVar6;
  uVar2 = -(ulong)(dVar5 < -dVar5);
  uVar3 = -(ulong)(_t1 < -_t1);
  dVar4 = (double)(~uVar3 & (ulong)_t1 | (ulong)-_t1 & uVar3);
  uVar3 = -(ulong)(dVar6 < -dVar6);
  dVar6 = (double)(~uVar3 & (ulong)dVar6 | (ulong)-dVar6 & uVar3);
  if (dVar6 <= dVar4) {
    dVar4 = dVar6;
  }
  if (dVar4 < (double)(~uVar2 & (ulong)dVar5 | (ulong)-dVar5 & uVar2) * 1000000000000.0) {
    QGraphicsItem::pos();
    QGraphicsItem::pos();
    QGraphicsItem::pos();
    QGraphicsItem::setPos((QPointF *)&this->super_QGraphicsRectItem);
    moved(this,_t1);
  }
  return;
}

Assistant:

void RectHandle::setPosition(double p) {
    p = qBound(m_min_pos, p, m_max_pos);
    if (qFuzzyCompare(p, position()))
        return;

    if (m_orientation == Qt::Horizontal)
        moveBy(0, p - position());
    else
        moveBy(p - position(), 0);

    emit moved(p);
}